

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Action_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::IO_Action_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,IO_Action_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  reference this_00;
  StandardVariable *pSVar3;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  string local_340 [32];
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
  local_320;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_2f0;
  KString local_2d0;
  KString local_2b0;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  IO_Action_PDU *local_18;
  IO_Action_PDU *this_local;
  
  local_18 = this;
  this_local = (IO_Action_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-IO Action PDU-");
  IO_Header::GetAsString_abi_cxx11_(&local_1f0,&this->super_IO_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Receiving Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_230,&this->m_RecEntityID);
  UTILS::IndentString(&local_210,&local_230,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"Request ID:   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui32ReqId);
  poVar2 = std::operator<<(poVar2,"Warfare Type: ");
  DATA_TYPE::ENUMS::GetEnumAsStringWarfareType_abi_cxx11_
            (&local_250,(ENUMS *)(ulong)this->m_ui16WrTyp,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  poVar2 = std::operator<<(poVar2,"\nSimulation Source: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16SimSrc);
  poVar2 = std::operator<<(poVar2,"\nAction Type: ");
  DATA_TYPE::ENUMS::GetEnumAsStringActionType_abi_cxx11_
            (&local_270,(ENUMS *)(ulong)this->m_ui16ActTyp,Value_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_270);
  poVar2 = std::operator<<(poVar2,"\nAction Phase: ");
  DATA_TYPE::ENUMS::GetEnumAsStringActionPhase_abi_cxx11_
            (&local_290,(ENUMS *)(ulong)this->m_ui16ActPhs,Value_01);
  poVar2 = std::operator<<(poVar2,(string *)&local_290);
  poVar2 = std::operator<<(poVar2,"\nAttacker ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_2d0,&this->m_AtkEntityID);
  UTILS::IndentString(&local_2b0,&local_2d0,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_2b0);
  poVar2 = std::operator<<(poVar2,"Primary Target ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_((KString *)&citr,&this->m_TgtEntityID);
  UTILS::IndentString(&local_2f0,(KString *)&citr,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_2f0);
  poVar2 = std::operator<<(poVar2,"Number of standard variable records: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumStdVarRec);
  std::operator<<(poVar2,"\nStandard Variables:\n");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::
            vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
            ::begin(&this->m_vStdVarRecs);
  local_320._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
       ::end(&this->m_vStdVarRecs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_320);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
              ::operator*(&citrEnd);
    pSVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::operator->(this_00);
    (*(pSVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(local_340);
    std::operator<<(local_190,local_340);
    std::__cxx11::string::~string(local_340);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString IO_Action_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-IO Action PDU-"
       << IO_Header::GetAsString()
       << "Receiving Entity ID:\n"
       << IndentString( m_RecEntityID.GetAsString(), 1 )
       << "Request ID:   "        << m_ui32ReqId
       << "Warfare Type: "        << GetEnumAsStringWarfareType( m_ui16WrTyp )
       << "\nSimulation Source: " << m_ui16SimSrc
       << "\nAction Type: "       << GetEnumAsStringActionType( m_ui16ActTyp )
       << "\nAction Phase: "      << GetEnumAsStringActionPhase( m_ui16ActPhs )
       << "\nAttacker ID:\n"
       << IndentString( m_AtkEntityID.GetAsString(), 1 )
       << "Primary Target ID:\n"
       << IndentString( m_TgtEntityID.GetAsString(), 1 )
       << "Number of standard variable records: " << m_ui16NumStdVarRec
       << "\nStandard Variables:\n";

    vector<StdVarPtr>::const_iterator citr = m_vStdVarRecs.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vStdVarRecs.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << ( *citr )->GetAsString();
    }

    return ss.str();
}